

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall
helics::apps::App::loadJsonFileConfiguration
          (App *this,string *appName,string *jsonString,bool enableFederateInterfaceRegistration)

{
  element_type *peVar1;
  bool bVar2;
  reference pvVar3;
  undefined3 in_register_00000009;
  json doc;
  data dStack_58;
  JsonBuffer local_48;
  key_type local_40;
  
  if (CONCAT31(in_register_00000009,enableFederateInterfaceRegistration) != 0) {
    peVar1 = (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_ValueFederate)._vptr_ValueFederate[3])(peVar1,jsonString);
  }
  fileops::loadJson((fileops *)&dStack_58,(string *)jsonString);
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[4],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_58,(char (*) [4])0x3382c5);
  if (bVar2) {
    local_48.reference =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&dStack_58,"app");
    loadConfigOptions(this,&local_48);
  }
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_58,(char (*) [7])0x346271);
  if (bVar2) {
    local_48.reference =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)&dStack_58,"config");
    loadConfigOptions(this,&local_48);
  }
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_58,appName);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_40,appName);
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&dStack_58,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    local_48.reference = pvVar3;
    loadConfigOptions(this,&local_48);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&dStack_58);
  return;
}

Assistant:

void App::loadJsonFileConfiguration(const std::string& appName,
                                    const std::string& jsonString,
                                    bool enableFederateInterfaceRegistration)
{
    if (enableFederateInterfaceRegistration) {
        fed->registerInterfaces(jsonString);
    }
    auto doc = fileops::loadJson(jsonString);

    if (doc.contains("app")) {
        auto& appConfig = doc["app"];
        loadConfigOptions(appConfig);
    }
    if (doc.contains("config")) {
        auto& appConfig = doc["config"];
        loadConfigOptions(appConfig);
    }
    if (doc.contains(appName)) {
        auto& appConfig = doc[appName];
        loadConfigOptions(appConfig);
    }
}